

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O3

person * __thiscall
rest_rpc::req_result::as<person>(person *__return_storage_ptr__,req_result *this)

{
  const_pointer pcVar1;
  logic_error *this_00;
  size_type sVar2;
  pointer *__ptr;
  string_view result;
  string_view result_00;
  string err_msg;
  undefined1 local_44 [4];
  undefined1 local_40 [32];
  
  sVar2 = (this->data_)._M_string_length;
  if (sVar2 != 0) {
    local_40._0_8_ = local_40._0_8_ & 0xffffffff00000000;
    local_40._24_8_ = (zone *)0x0;
    rpc_service::msgpack_codec::unpack<std::tuple<int>>
              ((msgpack_codec *)local_44,local_40,(size_t)(this->data_)._M_dataplus._M_p);
    if ((zone *)local_40._24_8_ != (zone *)0x0) {
      std::default_delete<msgpack::v1::zone>::operator()
                ((default_delete<msgpack::v1::zone> *)(local_40 + 0x18),(zone *)local_40._24_8_);
    }
    if (local_44 == (undefined1  [4])0x0) {
      result.size_ = sVar2;
      result.data_ = (const_pointer)(this->data_)._M_string_length;
      get_result<person>(__return_storage_ptr__,(rest_rpc *)(this->data_)._M_dataplus._M_p,result);
      return __return_storage_ptr__;
    }
    pcVar1 = (const_pointer)(this->data_)._M_string_length;
    if (pcVar1 != (const_pointer)0x0) {
      result_00.size_ = sVar2;
      result_00.data_ = pcVar1;
      get_error_msg_abi_cxx11_
                ((string *)local_40,(rest_rpc *)(this->data_)._M_dataplus._M_p,result_00);
      goto LAB_00177f4d;
    }
  }
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_40,(this->data_)._M_dataplus._M_p);
LAB_00177f4d:
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T as() {
    if (has_error(data_)) {
      std::string err_msg = data_.empty() ? data_ : get_error_msg(data_);
      throw std::logic_error(err_msg);
    }

    return get_result<T>(data_);
  }